

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O2

void __thiscall
asio::detail::op_queue<asio::detail::scheduler_operation>::push<asio::detail::reactor_op>
          (op_queue<asio::detail::scheduler_operation> *this,op_queue<asio::detail::reactor_op> *q)

{
  scheduler_operation *psVar1;
  
  if (q->front_ != (reactor_op *)0x0) {
    psVar1 = this->back_;
    if (this->back_ == (scheduler_operation *)0x0) {
      psVar1 = (scheduler_operation *)this;
    }
    psVar1->next_ = &q->front_->super_operation;
    this->back_ = &q->back_->super_operation;
    q->front_ = (reactor_op *)0x0;
    q->back_ = (reactor_op *)0x0;
  }
  return;
}

Assistant:

void push(op_queue<OtherOperation>& q)
  {
    if (Operation* other_front = op_queue_access::front(q))
    {
      if (back_)
        op_queue_access::next(back_, other_front);
      else
        front_ = other_front;
      back_ = op_queue_access::back(q);
      op_queue_access::front(q) = 0;
      op_queue_access::back(q) = 0;
    }
  }